

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_151d8d0::
MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>
::SetUp(MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>
        *this)

{
  bool bVar1;
  int iVar2;
  ParamType *__src;
  long lVar3;
  uint8_t *puVar4;
  MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>
  *in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_t unit;
  undefined8 in_stack_ffffffffffffff58;
  AssertHelper *in_stack_ffffffffffffff60;
  uchar **in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  ACMRandom *expr1;
  Type in_stack_ffffffffffffff8c;
  AssertHelper *in_stack_ffffffffffffff90;
  AssertionResult local_60;
  uint local_4c;
  Message *message;
  AssertHelper *in_stack_ffffffffffffffe0;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  __src = testing::
          WithParamInterface<(anonymous_namespace)::TestParams<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>
          ::GetParam();
  memcpy(&in_RDI->params_,__src,0x2c);
  expr1 = &in_RDI->rnd_;
  libaom_test::ACMRandom::DeterministicSeed();
  libaom_test::ACMRandom::Reset((ACMRandom *)in_stack_ffffffffffffff60,iVar2);
  bVar1 = use_high_bit_depth(in_RDI);
  lVar3 = 1;
  if (bVar1) {
    lVar3 = 2;
  }
  block_size(in_RDI);
  puVar4 = (uint8_t *)aom_memalign((size_t)expr1,(size_t)in_stack_ffffffffffffff70);
  in_RDI->src_ = puVar4;
  iVar2 = block_size(in_RDI);
  puVar4 = (uint8_t *)operator_new__(iVar2 * lVar3);
  in_RDI->ref_ = puVar4;
  message = (Message *)0x0;
  testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
            ((char *)expr1,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             &in_stack_ffffffffffffff60->data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffe0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff70 =
         testing::AssertionResult::failure_message((AssertionResult *)0xcb9967);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,(char *)in_RDI,
               (int)((ulong)expr1 >> 0x20),in_stack_ffffffffffffff70);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffe0,message);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff60);
    testing::Message::~Message((Message *)0xcb99b5);
  }
  local_4c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xcb9a1b);
  if (local_4c == 0) {
    testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
              ((char *)expr1,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               &in_stack_ffffffffffffff60->data_);
    iVar2 = (int)((ulong)expr1 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff90);
      testing::AssertionResult::failure_message((AssertionResult *)0xcb9a96);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,(char *)in_RDI,iVar2,
                 in_stack_ffffffffffffff70);
      testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffe0,message);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff60);
      testing::Message::~Message((Message *)0xcb9ae4);
    }
    local_4c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcb9b4a);
    if (local_4c == 0) {
      puVar4 = in_RDI->src_;
      iVar2 = block_size(in_RDI);
      memset(puVar4,0,(long)iVar2);
      puVar4 = in_RDI->ref_;
      iVar2 = block_size(in_RDI);
      memset(puVar4,0,(long)iVar2);
      bVar1 = use_high_bit_depth(in_RDI);
      if (bVar1) {
        in_RDI->src_ = (uint8_t *)((ulong)in_RDI->src_ >> 1);
        in_RDI->ref_ = (uint8_t *)((ulong)in_RDI->ref_ >> 1);
      }
    }
  }
  return;
}

Assistant:

void SetUp() override {
    params_ = this->GetParam();

    rnd_.Reset(ACMRandom::DeterministicSeed());
    const size_t unit =
        use_high_bit_depth() ? sizeof(uint16_t) : sizeof(uint8_t);
    src_ = reinterpret_cast<uint8_t *>(aom_memalign(16, block_size() * unit));
    ref_ = new uint8_t[block_size() * unit];
    ASSERT_NE(src_, nullptr);
    ASSERT_NE(ref_, nullptr);
    memset(src_, 0, block_size() * sizeof(src_[0]));
    memset(ref_, 0, block_size() * sizeof(ref_[0]));
    if (use_high_bit_depth()) {
      // TODO(skal): remove!
      src_ = CONVERT_TO_BYTEPTR(src_);
      ref_ = CONVERT_TO_BYTEPTR(ref_);
    }
  }